

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  byte bVar1;
  byte bVar2;
  Db *pDVar3;
  int iVar4;
  ulong uVar5;
  Table *pTVar6;
  HashElem *pHVar7;
  long lVar8;
  char *pKey;
  Hash *pH;
  ulong uVar9;
  Hash *pH_00;
  bool bVar10;
  
  if (zDatabase != (char *)0x0) {
    uVar5 = (ulong)db->nDb;
    bVar10 = 0 < (long)uVar5;
    if (0 < (long)uVar5) {
      uVar9 = 0;
LAB_0012f304:
      lVar8 = 0;
      do {
        bVar1 = zDatabase[lVar8];
        bVar2 = db->aDb[uVar9].zDbSName[lVar8];
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) goto LAB_0012f337;
        }
        else if (""[bVar1] != ""[bVar2]) goto LAB_0012f337;
        lVar8 = lVar8 + 1;
      } while( true );
    }
LAB_0012f43a:
    lVar8 = 0;
    do {
      bVar1 = zDatabase[lVar8];
      bVar2 = "main"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0012f46e;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0012f46e;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  pDVar3 = db->aDb;
  pH = &(pDVar3[1].pSchema)->tblHash;
  pHVar7 = findElementWithHash(pH,zName,(uint *)0x0);
  if ((Table *)pHVar7->data != (Table *)0x0) {
    return (Table *)pHVar7->data;
  }
  pH_00 = &pDVar3->pSchema->tblHash;
  pHVar7 = findElementWithHash(pH_00,zName,(uint *)0x0);
  if ((Table *)pHVar7->data != (Table *)0x0) {
    return (Table *)pHVar7->data;
  }
  iVar4 = db->nDb;
  if (2 < (long)iVar4) {
    lVar8 = 0;
    do {
      pHVar7 = findElementWithHash((Hash *)(*(long *)((long)&pDVar3[2].pSchema + lVar8) + 8),zName,
                                   (uint *)0x0);
      pTVar6 = (Table *)pHVar7->data;
      if (pTVar6 != (Table *)0x0) goto LAB_0012f3d3;
      lVar8 = lVar8 + 0x20;
    } while ((long)iVar4 * 0x20 + -0x40 != lVar8);
  }
  pTVar6 = (Table *)0x0;
LAB_0012f3d3:
  if (pTVar6 != (Table *)0x0) {
    return pTVar6;
  }
  iVar4 = sqlite3_strnicmp(zName,"sqlite_",7);
  if (iVar4 != 0) {
    return (Table *)0x0;
  }
  lVar8 = 7;
  do {
    bVar1 = zName[lVar8];
    bVar2 = "sqlite_schema"[lVar8];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0012f5bc;
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_0012f5bc;
    lVar8 = lVar8 + 1;
  } while( true );
LAB_0012f337:
  if (bVar1 == bVar2) {
    if (bVar10) goto LAB_0012f476;
    goto LAB_0012f43a;
  }
  uVar9 = uVar9 + 1;
  bVar10 = uVar9 < uVar5;
  if (uVar9 == uVar5) goto LAB_0012f43a;
  goto LAB_0012f304;
LAB_0012f46e:
  uVar9 = 0;
  if (bVar1 != bVar2) {
    return (Table *)0x0;
  }
LAB_0012f476:
  pDVar3 = db->aDb;
  pH = &(pDVar3[uVar9 & 0xffffffff].pSchema)->tblHash;
  pHVar7 = findElementWithHash(pH,zName,(uint *)0x0);
  if ((Table *)pHVar7->data != (Table *)0x0) {
    return (Table *)pHVar7->data;
  }
  iVar4 = sqlite3_strnicmp(zName,"sqlite_",7);
  if (iVar4 != 0) {
    return (Table *)0x0;
  }
  if ((int)uVar9 != 1) {
    lVar8 = 7;
    do {
      bVar1 = zName[lVar8];
      bVar2 = "sqlite_schema"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0012f573;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0012f573;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  lVar8 = 7;
  do {
    bVar1 = zName[lVar8];
    bVar2 = "sqlite_temp_schema"[lVar8];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0012f53b;
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_0012f53b;
    lVar8 = lVar8 + 1;
  } while( true );
LAB_0012f573:
  if (bVar1 != bVar2) {
    return (Table *)0x0;
  }
  pKey = "sqlite_master";
  goto LAB_0012f5e5;
LAB_0012f53b:
  if (bVar1 != bVar2) {
    lVar8 = 7;
    do {
      bVar1 = zName[lVar8];
      bVar2 = "sqlite_schema"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0012f588;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0012f588;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  goto LAB_0012f5d6;
LAB_0012f5cd:
  if (bVar1 != bVar2) {
    return (Table *)0x0;
  }
  goto LAB_0012f5d6;
LAB_0012f5bc:
  if (bVar1 != bVar2) {
    lVar8 = 7;
    do {
      bVar1 = zName[lVar8];
      bVar2 = "sqlite_temp_schema"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0012f624;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0012f624;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  pKey = "sqlite_master";
  pH = pH_00;
  goto LAB_0012f5e5;
LAB_0012f624:
  if (bVar1 != bVar2) {
    return (Table *)0x0;
  }
  pKey = "sqlite_temp_master";
  goto LAB_0012f5e5;
LAB_0012f588:
  if (bVar1 != bVar2) {
    lVar8 = 7;
    do {
      bVar1 = zName[lVar8];
      bVar2 = "sqlite_master"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0012f5cd;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0012f5cd;
      lVar8 = lVar8 + 1;
    } while( true );
  }
LAB_0012f5d6:
  pKey = "sqlite_temp_master";
  pH = &(pDVar3[1].pSchema)->tblHash;
LAB_0012f5e5:
  pHVar7 = findElementWithHash(pH,pKey,(uint *)0x0);
  return (Table *)pHVar7->data;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  if( zDatabase ){
    for(i=0; i<db->nDb; i++){
      if( sqlite3StrICmp(zDatabase, db->aDb[i].zDbSName)==0 ) break;
    }
    if( i>=db->nDb ){
      /* No match against the official names.  But always match "main"
      ** to schema 0 as a legacy fallback. */
      if( sqlite3StrICmp(zDatabase,"main")==0 ){
        i = 0;
      }else{
        return 0;
      }
    }
    p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( i==1 ){
        if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0
         || sqlite3StrICmp(zName+7, &LEGACY_SCHEMA_TABLE[7])==0
        ){
          p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                              LEGACY_TEMP_SCHEMA_TABLE);
        }
      }else{
        if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
          p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash,
                              LEGACY_SCHEMA_TABLE);
        }
      }
    }
  }else{
    /* Match against TEMP first */
    p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash, zName);
    if( p ) return p;
    /* The main database is second */
    p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, zName);
    if( p ) return p;
    /* Attached databases are in order of attachment */
    for(i=2; i<db->nDb; i++){
      assert( sqlite3SchemaMutexHeld(db, i, 0) );
      p = sqlite3HashFind(&db->aDb[i].pSchema->tblHash, zName);
      if( p ) break;
    }
    if( p==0 && sqlite3StrNICmp(zName, "sqlite_", 7)==0 ){
      if( sqlite3StrICmp(zName+7, &PREFERRED_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[0].pSchema->tblHash, LEGACY_SCHEMA_TABLE);
      }else if( sqlite3StrICmp(zName+7, &PREFERRED_TEMP_SCHEMA_TABLE[7])==0 ){
        p = sqlite3HashFind(&db->aDb[1].pSchema->tblHash,
                            LEGACY_TEMP_SCHEMA_TABLE);
      }
    }
  }
  return p;
}